

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O3

void av1_highbd_warp_affine_c
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  byte bVar17;
  uint16_t uVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  byte local_2f8;
  long local_2f0;
  int local_2e4;
  int aiStack_218 [122];
  
  iVar1 = conv_params->is_compound;
  bVar7 = (byte)conv_params->round_0;
  if (iVar1 == 0) {
    local_2f8 = 0xe - bVar7;
    bVar17 = (byte)conv_params->round_1;
  }
  else {
    local_2f8 = (byte)conv_params->round_1;
    bVar17 = local_2f8;
  }
  if (0 < p_height) {
    bVar16 = 0xe - (bVar17 + bVar7);
    bVar8 = (byte)bd;
    bVar17 = (bVar8 + 0xe) - (bVar17 + bVar7);
    iVar21 = (1 << (local_2f8 & 0x1f)) >> 1;
    iVar12 = p_row;
    do {
      if (0 < p_width) {
        iVar2 = mat[2];
        iVar3 = mat[3];
        lVar13 = (long)(iVar12 + 4 << ((byte)subsampling_y & 0x1f));
        iVar4 = *mat;
        iVar5 = mat[4];
        iVar6 = mat[5];
        iVar9 = (p_height + p_row) - iVar12;
        iVar22 = iVar9 + -4;
        if (8 < iVar9) {
          iVar22 = 4;
        }
        iVar9 = mat[1];
        iVar11 = p_col;
        do {
          lVar14 = (long)(iVar11 + 4 << ((byte)subsampling_x & 0x1f));
          lVar26 = iVar2 * lVar14 + (long)iVar4 + iVar3 * lVar13 >> ((byte)subsampling_x & 0x3f);
          lVar14 = lVar14 * iVar5 + (long)iVar9 + iVar6 * lVar13 >> ((byte)subsampling_y & 0x3f);
          lVar20 = -7;
          do {
            lVar15 = (int)((ulong)lVar14 >> 0x10) + lVar20;
            iVar10 = (int)lVar15;
            iVar23 = height + -1;
            if (iVar10 < height + -1) {
              iVar23 = iVar10;
            }
            if (lVar15 < 0) {
              iVar23 = 0;
            }
            iVar28 = ((int)lVar20 + 4) * (int)beta +
                     (((uint)lVar26 & 0xfffc) + ((int)alpha + (int)beta) * -4 & 0xffffffc0);
            lVar15 = -4;
            iVar10 = (int)((ulong)lVar26 >> 0x10) + -7;
            do {
              lVar27 = 0;
              iVar29 = 1 << (bVar8 + 6 & 0x1f);
              do {
                iVar30 = iVar10 + (int)lVar27;
                if (width + -1 <= iVar30) {
                  iVar30 = width + -1;
                }
                if (iVar10 + lVar27 < 0) {
                  iVar30 = 0;
                }
                iVar29 = iVar29 + (int)*(short *)((long)(iVar28 + 0x200 >> 10) * 0x10 + 0x55d670 +
                                                 lVar27 * 2) * (uint)ref[iVar30 + iVar23 * stride];
                lVar27 = lVar27 + 1;
              } while (lVar27 != 8);
              aiStack_218[lVar20 * 8 + 0x3c + lVar15] =
                   iVar29 + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f);
              iVar28 = iVar28 + alpha;
              lVar15 = lVar15 + 1;
              iVar10 = iVar10 + 1;
            } while (lVar15 != 4);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 8);
          if (-4 < iVar22) {
            iVar10 = (p_width + p_col) - iVar11;
            iVar23 = iVar10 + -4;
            if (8 < iVar10) {
              iVar23 = 4;
            }
            iVar10 = (iVar11 - p_col) + 4;
            local_2f0 = -4;
            local_2e4 = 0;
            do {
              if (-4 < iVar23) {
                iVar29 = (iVar12 - p_row) + 4 + (int)local_2f0;
                iVar24 = iVar29 * p_stride;
                iVar30 = ((int)local_2f0 + 4) * (int)delta +
                         (((uint)lVar14 & 0xfffc) + ((int)delta + (int)gamma) * -4 & 0xffffffc0);
                lVar20 = -4;
                iVar28 = local_2e4;
                do {
                  lVar26 = 0;
                  iVar31 = 1 << ((bVar8 + 0xe) - bVar7 & 0x1f);
                  iVar25 = iVar28;
                  do {
                    iVar31 = iVar31 + (int)*(short *)((long)(iVar30 + 0x200 >> 10) * 0x10 + 0x55d670
                                                     + lVar26 * 2) * aiStack_218[iVar25];
                    lVar26 = lVar26 + 1;
                    iVar25 = iVar25 + 8;
                  } while (lVar26 != 8);
                  if (iVar1 == 0) {
                    uVar33 = (iVar31 + iVar21 >> (local_2f8 & 0x1f)) +
                             (-1 << (bVar8 & 0x1f)) + (-1 << (bVar8 - 1 & 0x1f));
                    if (bd == 10) {
                      uVar19 = 0x3ff;
                    }
                    else if (bd == 0xc) {
                      uVar19 = 0xfff;
                    }
                    else {
                      uVar19 = 0xff;
                    }
                    if (uVar33 < uVar19) {
                      uVar19 = uVar33;
                    }
                    uVar18 = (uint16_t)uVar19;
                    iVar25 = iVar10 + iVar24 + (int)lVar20;
LAB_003ad151:
                    if ((int)uVar33 < 0) {
                      uVar18 = 0;
                    }
                    pred[iVar25] = uVar18;
                  }
                  else {
                    iVar25 = iVar10 + (int)lVar20;
                    iVar32 = iVar31 + iVar21 >> (local_2f8 & 0x1f);
                    iVar31 = conv_params->dst_stride * iVar29 + iVar25;
                    if (conv_params->do_average != 0) {
                      uVar33 = (uint)conv_params->dst[iVar31];
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        iVar31 = (int)(iVar32 + uVar33) >> 1;
                      }
                      else {
                        iVar31 = (int)(iVar32 * conv_params->bck_offset +
                                      uVar33 * conv_params->fwd_offset) >> 4;
                      }
                      uVar33 = iVar31 + ((1 << (bVar16 & 0x1f)) >> 1) +
                                        (-1 << (bVar17 - 1 & 0x1f)) + (-1 << (bVar17 & 0x1f)) >>
                               (bVar16 & 0x1f);
                      if (bd == 10) {
                        uVar19 = 0x3ff;
                      }
                      else if (bd == 0xc) {
                        uVar19 = 0xfff;
                      }
                      else {
                        uVar19 = 0xff;
                      }
                      if (uVar33 < uVar19) {
                        uVar19 = uVar33;
                      }
                      uVar18 = (uint16_t)uVar19;
                      iVar25 = iVar25 + iVar24;
                      goto LAB_003ad151;
                    }
                    conv_params->dst[iVar31] = (CONV_BUF_TYPE)iVar32;
                  }
                  iVar30 = iVar30 + gamma;
                  lVar20 = lVar20 + 1;
                  iVar28 = iVar28 + 1;
                } while (lVar20 < iVar23);
              }
              local_2f0 = local_2f0 + 1;
              local_2e4 = local_2e4 + 8;
            } while (local_2f0 < iVar22);
          }
          iVar11 = iVar11 + 8;
        } while (iVar11 < p_width + p_col);
      }
      iVar12 = iVar12 + 8;
    } while (iVar12 < p_height + p_row);
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_c(const int32_t *mat, const uint16_t *ref,
                              int width, int height, int stride, uint16_t *pred,
                              int p_col, int p_row, int p_width, int p_height,
                              int p_stride, int subsampling_x,
                              int subsampling_y, int bd,
                              ConvolveParams *conv_params, int16_t alpha,
                              int16_t beta, int16_t gamma, int16_t delta) {
  int32_t tmp[15 * 8];
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  for (int i = p_row; i < p_row + p_height; i += 8) {
    for (int j = p_col; j < p_col + p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (j + 4) << subsampling_x;
      const int32_t src_y = (i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      const int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      const int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4);
      sy4 += gamma * (-4) + delta * (-4);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      for (int k = -7; k < 8; ++k) {
        const int iy = clamp(iy4 + k, 0, height - 1);

        int sx = sx4 + beta * (k + 4);
        for (int l = -4; l < 4; ++l) {
          int ix = ix4 + l - 3;
          const int offs = ROUND_POWER_OF_TWO(sx, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_horiz;
          for (int m = 0; m < 8; ++m) {
            const int sample_x = clamp(ix + m, 0, width - 1);
            sum += ref[iy * stride + sample_x] * coeffs[m];
          }
          sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
          assert(0 <= sum && sum < (1 << max_bits_horiz));
          tmp[(k + 7) * 8 + (l + 4)] = sum;
          sx += alpha;
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_row + p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        for (int l = -4; l < AOMMIN(4, p_col + p_width - j - 4); ++l) {
          const int offs = ROUND_POWER_OF_TWO(sy, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_vert;
          for (int m = 0; m < 8; ++m) {
            sum += tmp[(k + m + 4) * 8 + (l + 4)] * coeffs[m];
          }

          if (conv_params->is_compound) {
            CONV_BUF_TYPE *p =
                &conv_params
                     ->dst[(i - p_row + k + 4) * conv_params->dst_stride +
                           (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            if (conv_params->do_average) {
              uint16_t *dst16 =
                  &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
              int32_t tmp32 = *p;
              if (conv_params->use_dist_wtd_comp_avg) {
                tmp32 = tmp32 * conv_params->fwd_offset +
                        sum * conv_params->bck_offset;
                tmp32 = tmp32 >> DIST_PRECISION_BITS;
              } else {
                tmp32 += sum;
                tmp32 = tmp32 >> 1;
              }
              tmp32 = tmp32 - (1 << (offset_bits - conv_params->round_1)) -
                      (1 << (offset_bits - conv_params->round_1 - 1));
              *dst16 =
                  clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp32, round_bits), bd);
            } else {
              *p = sum;
            }
          } else {
            uint16_t *p =
                &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            assert(0 <= sum && sum < (1 << (bd + 2)));
            *p = clip_pixel_highbd(sum - (1 << (bd - 1)) - (1 << bd), bd);
          }
          sy += gamma;
        }
      }
    }
  }
}